

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteTargets(cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root)

{
  pointer ppcVar1;
  cmGeneratorTarget *this_00;
  pointer ppcVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  string *psVar6;
  undefined4 extraout_var;
  cmGlobalGhsMultiGenerator *pcVar7;
  cmGeneratorTarget **tgt;
  pointer ppcVar8;
  pointer ppcVar9;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> build;
  string rootBinaryDir;
  string name;
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string message;
  cmGeneratedFileStream fbld;
  
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(root);
  std::__cxx11::string::string((string *)&rootBinaryDir,(string *)psVar6);
  std::__cxx11::string::append((char *)&rootBinaryDir);
  ppcVar9 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppcVar9 == ppcVar1) {
      std::__cxx11::string::~string((string *)&rootBinaryDir);
      return;
    }
    this_00 = *ppcVar9;
    TVar4 = cmGeneratorTarget::GetType(this_00);
    if (((TVar4 != INTERFACE_LIBRARY) &&
        (TVar4 = cmGeneratorTarget::GetType(this_00), TVar4 != MODULE_LIBRARY)) &&
       (TVar4 = cmGeneratorTarget::GetType(this_00), TVar4 != SHARED_LIBRARY)) {
      TVar4 = cmGeneratorTarget::GetType(this_00);
      if (TVar4 == GLOBAL_TARGET) {
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        iVar5 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x18])();
        bVar3 = std::operator!=(psVar6,(char *)CONCAT44(extraout_var,iVar5));
        if (bVar3) goto LAB_002497af;
      }
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fbld,
                     psVar6,".tgt");
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &fbld,FILE_EXTENSION);
      std::__cxx11::string::~string((string *)&fbld);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fbld,
                     &rootBinaryDir,"/");
      std::operator+(&fname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &fbld,&name);
      std::__cxx11::string::~string((string *)&fbld);
      cmGeneratedFileStream::cmGeneratedFileStream(&fbld,&fname,false,None);
      pcVar7 = (cmGlobalGhsMultiGenerator *)&fbld;
      cmGeneratedFileStream::SetCopyIfDifferent(&fbld,true);
      WriteFileHeader(pcVar7,(ostream *)&fbld);
      GhsMultiGpj::WriteGpjTag(PROJECT,(ostream *)&fbld);
      build.
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      build.
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      build.
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar7 = this;
      bVar3 = ComputeTargetBuildOrder(this,this_00,&build);
      ppcVar2 = build.
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppcVar8 = build.
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (bVar3) {
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        std::operator+(&local_2b8,"The inter-target dependency graph for target [",psVar6);
        std::operator+(&message,&local_2b8,"] had a cycle.\n");
        std::__cxx11::string::~string((string *)&local_2b8);
        cmSystemTools::Error(&message);
        std::__cxx11::string::~string((string *)&message);
      }
      else {
        for (; ppcVar8 != ppcVar2; ppcVar8 = ppcVar8 + 1) {
          WriteProjectLine(pcVar7,(ostream *)&fbld,*ppcVar8,root,&rootBinaryDir);
        }
      }
      cmGeneratedFileStream::Close(&fbld);
      std::_Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
      ~_Vector_base(&build.
                     super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   );
      cmGeneratedFileStream::~cmGeneratedFileStream(&fbld);
      std::__cxx11::string::~string((string *)&fname);
      std::__cxx11::string::~string((string *)&name);
    }
LAB_002497af:
    ppcVar9 = ppcVar9 + 1;
  } while( true );
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTargets(cmLocalGenerator* root)
{
  std::string rootBinaryDir = root->GetCurrentBinaryDirectory();
  rootBinaryDir += "/CMakeFiles";

  // All known targets
  for (cmGeneratorTarget const* target : this->ProjectTargets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
         target->GetName() != GetInstallTargetName())) {
      continue;
    }

    // create target build file
    std::string name = target->GetName() + ".tgt" + FILE_EXTENSION;
    std::string fname = rootBinaryDir + "/" + name;
    cmGeneratedFileStream fbld(fname);
    fbld.SetCopyIfDifferent(true);
    this->WriteFileHeader(fbld);
    GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fbld);
    std::vector<cmGeneratorTarget const*> build;
    if (ComputeTargetBuildOrder(target, build)) {
      std::string message = "The inter-target dependency graph for target [" +
        target->GetName() + "] had a cycle.\n";
      cmSystemTools::Error(message);
    } else {
      for (auto& tgt : build) {
        WriteProjectLine(fbld, tgt, root, rootBinaryDir);
      }
    }
    fbld.Close();
  }
}